

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp3::sPolynomial4
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  double dVar4;
  double dVar5;
  Index in_stack_fffffffffffffed8;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *in_stack_fffffffffffffee0;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *this;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0x900fd5);
  row = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)row,0x900ff4);
  dVar4 = row / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)row,0x90101a);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90103b);
  dVar5 = (double)this / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90106c);
  *pSVar3 = dVar4 - dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90108c);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9010ac);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9010d3);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9010f4);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901125);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901145);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901165);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90118c);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9011ad);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9011de);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9011fe);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90121e);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901245);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901266);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901297);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9012b7);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9012da);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901307);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90132b);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901365);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901388);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9013ab);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9013d8);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9013fc);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901436);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901459);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90147c);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9014a9);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9014cd);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x901507);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90152a);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90154d);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90157a);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90159e);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9015d8);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9015fb);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90161e);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90164b);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x90166f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9016a9);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial4( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(4,9) = (groebnerMatrix(0,9)/(groebnerMatrix(0,8))-groebnerMatrix(1,9)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,10) = (groebnerMatrix(0,10)/(groebnerMatrix(0,8))-groebnerMatrix(1,10)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,11) = (groebnerMatrix(0,11)/(groebnerMatrix(0,8))-groebnerMatrix(1,11)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,12) = (groebnerMatrix(0,12)/(groebnerMatrix(0,8))-groebnerMatrix(1,12)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,13) = (groebnerMatrix(0,13)/(groebnerMatrix(0,8))-groebnerMatrix(1,13)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,14) = (groebnerMatrix(0,14)/(groebnerMatrix(0,8))-groebnerMatrix(1,14)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,15) = (groebnerMatrix(0,15)/(groebnerMatrix(0,8))-groebnerMatrix(1,15)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,16) = (groebnerMatrix(0,16)/(groebnerMatrix(0,8))-groebnerMatrix(1,16)/(groebnerMatrix(1,8)));
  groebnerMatrix(4,17) = (groebnerMatrix(0,17)/(groebnerMatrix(0,8))-groebnerMatrix(1,17)/(groebnerMatrix(1,8)));
}